

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint32_t helper_fmadd_tricore(CPUTriCoreState *env,uint32_t r1,uint32_t r2,uint32_t r3)

{
  float_status *s;
  byte bVar1;
  float32 arg1;
  float32 arg2;
  float32 arg3;
  byte flags;
  float32 local_34;
  
  s = &env->fp_status;
  local_34 = float32_muladd_tricore(r1,r2,r3,0,s);
  bVar1 = (env->fp_status).float_exception_flags;
  flags = bVar1 & 0xbd;
  if (flags == 0) {
    env->PSW_USB_C = 0;
  }
  else {
    if ((bVar1 & 1) != 0) {
      arg1 = float32_squash_input_denormal_tricore(r1,s);
      arg2 = float32_squash_input_denormal_tricore(r2,s);
      arg3 = float32_squash_input_denormal_tricore(r3,s);
      local_34 = f_maddsub_nan_result(arg1,arg2,arg3,local_34,0);
    }
    f_update_psw_flags(env,flags);
  }
  return local_34;
}

Assistant:

uint32_t helper_fmadd(CPUTriCoreState *env, uint32_t r1,
                      uint32_t r2, uint32_t r3)
{
    uint32_t flags;
    float32 arg1 = make_float32(r1);
    float32 arg2 = make_float32(r2);
    float32 arg3 = make_float32(r3);
    float32 f_result;

    f_result = float32_muladd(arg1, arg2, arg3, 0, &env->fp_status);

    flags = f_get_excp_flags(env);
    if (flags) {
        if (flags & float_flag_invalid) {
            arg1 = float32_squash_input_denormal(arg1, &env->fp_status);
            arg2 = float32_squash_input_denormal(arg2, &env->fp_status);
            arg3 = float32_squash_input_denormal(arg3, &env->fp_status);
            f_result = f_maddsub_nan_result(arg1, arg2, arg3, f_result, 0);
        }
        f_update_psw_flags(env, flags);
    } else {
        env->FPU_FS = 0;
    }
    return (uint32_t)f_result;
}